

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_unittest.h
# Opt level: O2

void __thiscall
google::protobuf::internal::gtest_suite_WireFormatTest_::
ParseMessageSetWithDuplicateTags<proto2_unittest::TestAllTypes>::TestBody
          (ParseMessageSetWithDuplicateTags<proto2_unittest::TestAllTypes> *this)

{
  Descriptor *this_00;
  FieldDescriptor *pFVar1;
  int extension_number;
  int extension_number_00;
  allocator<char> local_169;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  string local_e8;
  string message;
  string id;
  string end;
  string start;
  string other_message;
  string other_id;
  
  BuildMessageSetItemStart_abi_cxx11_();
  BuildMessageSetItemEnd_abi_cxx11_();
  this_00 = proto2_unittest::TestMessageSetExtension1::GetDescriptor();
  pFVar1 = Descriptor::extension(this_00,0);
  BuildMessageSetItemTypeId_abi_cxx11_
            (&id,(internal *)(ulong)(uint)pFVar1->number_,extension_number);
  BuildMessageSetItemTypeId_abi_cxx11_(&other_id,(internal *)0x1e240,extension_number_00);
  WireFormatTest<proto2_unittest::TestAllTypes>::BuildMessageSetTestExtension1_abi_cxx11_
            (&message,&this->super_WireFormatTest<proto2_unittest::TestAllTypes>,0x7b);
  WireFormatTest<proto2_unittest::TestAllTypes>::BuildMessageSetTestExtension1_abi_cxx11_
            (&other_message,&this->super_WireFormatTest<proto2_unittest::TestAllTypes>,0x141);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"id + other_id + message",&local_169);
  std::operator+(&local_168,&start,&id);
  std::operator+(&local_148,&local_168,&other_id);
  std::operator+(&local_128,&local_148,&message);
  std::operator+(&local_108,&local_128,&end);
  WireFormatTest<proto2_unittest::TestAllTypes>::ValidateTestMessageSet
            (&this->super_WireFormatTest<proto2_unittest::TestAllTypes>,&local_e8,&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"id + message + other_id",&local_169);
  std::operator+(&local_168,&start,&id);
  std::operator+(&local_148,&local_168,&message);
  std::operator+(&local_128,&local_148,&other_id);
  std::operator+(&local_108,&local_128,&end);
  WireFormatTest<proto2_unittest::TestAllTypes>::ValidateTestMessageSet
            (&this->super_WireFormatTest<proto2_unittest::TestAllTypes>,&local_e8,&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"message + id + other_id",&local_169);
  std::operator+(&local_168,&start,&message);
  std::operator+(&local_148,&local_168,&id);
  std::operator+(&local_128,&local_148,&other_id);
  std::operator+(&local_108,&local_128,&end);
  WireFormatTest<proto2_unittest::TestAllTypes>::ValidateTestMessageSet
            (&this->super_WireFormatTest<proto2_unittest::TestAllTypes>,&local_e8,&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"id + message + other_message",&local_169);
  std::operator+(&local_168,&start,&id);
  std::operator+(&local_148,&local_168,&message);
  std::operator+(&local_128,&local_148,&other_message);
  std::operator+(&local_108,&local_128,&end);
  WireFormatTest<proto2_unittest::TestAllTypes>::ValidateTestMessageSet
            (&this->super_WireFormatTest<proto2_unittest::TestAllTypes>,&local_e8,&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"message + id + other_message",&local_169);
  std::operator+(&local_168,&start,&message);
  std::operator+(&local_148,&local_168,&id);
  std::operator+(&local_128,&local_148,&other_message);
  std::operator+(&local_108,&local_128,&end);
  WireFormatTest<proto2_unittest::TestAllTypes>::ValidateTestMessageSet
            (&this->super_WireFormatTest<proto2_unittest::TestAllTypes>,&local_e8,&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"message + other_message + id",&local_169);
  std::operator+(&local_168,&start,&message);
  std::operator+(&local_148,&local_168,&other_message);
  std::operator+(&local_128,&local_148,&id);
  std::operator+(&local_108,&local_128,&end);
  WireFormatTest<proto2_unittest::TestAllTypes>::ValidateTestMessageSet
            (&this->super_WireFormatTest<proto2_unittest::TestAllTypes>,&local_e8,&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&other_message);
  std::__cxx11::string::~string((string *)&message);
  std::__cxx11::string::~string((string *)&other_id);
  std::__cxx11::string::~string((string *)&id);
  std::__cxx11::string::~string((string *)&end);
  std::__cxx11::string::~string((string *)&start);
  return;
}

Assistant:

TYPED_TEST_P(WireFormatTest, ParseMessageSetWithDuplicateTags) {
  std::string start = BuildMessageSetItemStart();
  std::string end = BuildMessageSetItemEnd();
  std::string id = BuildMessageSetItemTypeId(
      TestFixture::TestMessageSetExtension1::descriptor()
          ->extension(0)
          ->number());
  std::string other_id = BuildMessageSetItemTypeId(123456);
  std::string message = this->BuildMessageSetTestExtension1();
  std::string other_message = this->BuildMessageSetTestExtension1(321);

  // Double id
  this->ValidateTestMessageSet("id + other_id + message",
                               start + id + other_id + message + end);
  this->ValidateTestMessageSet("id + message + other_id",
                               start + id + message + other_id + end);
  this->ValidateTestMessageSet("message + id + other_id",
                               start + message + id + other_id + end);
  // Double message
  this->ValidateTestMessageSet("id + message + other_message",
                               start + id + message + other_message + end);
  this->ValidateTestMessageSet("message + id + other_message",
                               start + message + id + other_message + end);
  this->ValidateTestMessageSet("message + other_message + id",
                               start + message + other_message + id + end);
}